

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O0

void __thiscall
HModel::util_addCols
          (HModel *this,int ncols,double *XcolCost,double *XcolLower,double *XcolUpper,int nnonz,
          int *XAstart,int *XAindex,double *XAvalue)

{
  value_type vVar1;
  value_type vVar2;
  uint uVar3;
  reference pvVar4;
  uint *puVar5;
  reference pvVar6;
  int iVar7;
  long in_RCX;
  long in_RDX;
  uint in_ESI;
  long in_RDI;
  long in_R8;
  uint in_R9D;
  long in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000014;
  int in_stack_00000018;
  int in_stack_0000001c;
  HModel *in_stack_00000020;
  int row;
  int el;
  int col_1;
  int nwNnonz;
  int cuNnonz;
  int col;
  int nwNumCol;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  uint uVar8;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff90;
  int local_44;
  uint local_40;
  uint local_34;
  
  printf("Called model.util_addCols(ncols=%d, nnonz = %d)\n",(ulong)in_ESI,(ulong)in_R9D);
  std::ostream::operator<<((ostream *)&std::cout,std::flush<char,std::char_traits<char>>);
  printf("Called model.util_addCols(ncols=%d, nnonz = %d)\n",(ulong)in_ESI,(ulong)in_R9D);
  std::ostream::operator<<((ostream *)&std::cout,std::flush<char,std::char_traits<char>>);
  if (in_ESI != 0) {
    std::vector<double,_std::allocator<double>_>::resize
              (in_stack_ffffffffffffff90,
               CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    std::vector<double,_std::allocator<double>_>::resize
              (in_stack_ffffffffffffff90,
               CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    std::vector<double,_std::allocator<double>_>::resize
              (in_stack_ffffffffffffff90,
               CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    std::vector<double,_std::allocator<double>_>::resize
              (in_stack_ffffffffffffff90,
               CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff90,
               CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    for (local_34 = 0; (int)local_34 < (int)in_ESI; local_34 = local_34 + 1) {
      in_stack_ffffffffffffff90 =
           *(vector<double,_std::allocator<double>_> **)(in_RDX + (long)(int)local_34 * 8);
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x690),
                          (long)(int)(*(int *)(in_RDI + 0x60c) + local_34));
      *pvVar4 = (value_type)in_stack_ffffffffffffff90;
      vVar1 = *(value_type *)(in_RCX + (long)(int)local_34 * 8);
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x6a8),
                          (long)(int)(*(int *)(in_RDI + 0x60c) + local_34));
      *pvVar4 = vVar1;
      vVar1 = *(value_type *)(in_R8 + (long)(int)local_34 * 8);
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x6c0),
                          (long)(int)(*(int *)(in_RDI + 0x60c) + local_34));
      *pvVar4 = vVar1;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x6d8),
                          (long)(int)(*(int *)(in_RDI + 0x60c) + local_34));
      *pvVar4 = 1.0;
      puVar5 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                 ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x648),
                                  (long)*(int *)(in_RDI + 0x60c));
      printf("In HModel::util_addCols: column %d: setting Astart[numCol+col+1] = %d \n",
             (ulong)local_34,(ulong)*puVar5);
      std::ostream::operator<<((ostream *)&std::cout,std::flush<char,std::char_traits<char>>);
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x648),
                          (long)*(int *)(in_RDI + 0x60c));
      vVar2 = *pvVar6;
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x648),
                          (long)(int)(*(int *)(in_RDI + 0x60c) + local_34 + 1));
      *pvVar6 = vVar2;
    }
    uVar8 = in_R9D;
    puVar5 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x648),
                                (long)*(int *)(in_RDI + 0x60c));
    printf("In HModel::util_addCols: nnonz = %d; cuNnonz = %d\n",(ulong)uVar8,(ulong)*puVar5);
    std::ostream::operator<<((ostream *)&std::cout,std::flush<char,std::char_traits<char>>);
    if (0 < (int)in_R9D) {
      puVar5 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                 ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x648),
                                  (long)*(int *)(in_RDI + 0x60c));
      uVar3 = *puVar5;
      std::vector<int,_std::allocator<int>_>::resize
                ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff90,
                 CONCAT44(uVar8,in_stack_ffffffffffffff88));
      std::vector<double,_std::allocator<double>_>::resize
                (in_stack_ffffffffffffff90,CONCAT44(uVar8,in_stack_ffffffffffffff88));
      for (local_40 = 0; (int)local_40 < (int)in_ESI; local_40 = local_40 + 1) {
        printf("In HModel::util_addCols: column %d: setting Astart[numCol+col] = %d = %d + %d\n",
               (ulong)local_40,
               (ulong)(*(int *)(in_stack_00000008 + (long)(int)local_40 * 4) + uVar3),
               (ulong)*(uint *)(in_stack_00000008 + (long)(int)local_40 * 4),(ulong)uVar3);
        std::ostream::operator<<((ostream *)&std::cout,std::flush<char,std::char_traits<char>>);
        iVar7 = *(int *)(in_stack_00000008 + (long)(int)local_40 * 4) + uVar3;
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x648),
                            (long)(int)(*(int *)(in_RDI + 0x60c) + local_40));
        *pvVar6 = iVar7;
      }
      printf("In HModel::util_addCols: setting Astart[numCol+ncols] = %d\n",(ulong)(uVar3 + in_R9D))
      ;
      std::ostream::operator<<((ostream *)&std::cout,std::flush<char,std::char_traits<char>>);
      puVar5 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                 ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x648),
                                  (long)(int)(*(int *)(in_RDI + 0x60c) + in_ESI));
      *puVar5 = uVar3 + in_R9D;
      for (local_44 = 0; local_44 < (int)in_R9D; local_44 = local_44 + 1) {
        vVar2 = *(value_type *)(CONCAT44(in_stack_00000014,in_stack_00000010) + (long)local_44 * 4);
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x660),
                            (long)(int)(uVar3 + local_44));
        *pvVar6 = vVar2;
        vVar1 = *(value_type *)(CONCAT44(in_stack_0000001c,in_stack_00000018) + (long)local_44 * 8);
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x678),
                            (long)(int)(uVar3 + local_44));
        *pvVar4 = vVar1;
      }
    }
    *(uint *)(in_RDI + 0x60c) = in_ESI + *(int *)(in_RDI + 0x60c);
    *(uint *)(in_RDI + 0x614) = in_ESI + *(int *)(in_RDI + 0x614);
    uVar8 = *(uint *)(in_RDI + 0x60c);
    puVar5 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x648),
                                (long)*(int *)(in_RDI + 0x60c));
    printf("In HModel::util_addCols: Model now has Astart[%d] = %d nonzeros\n",(ulong)uVar8,
           (ulong)*puVar5);
    std::ostream::operator<<((ostream *)&std::cout,std::flush<char,std::char_traits<char>>);
    extendWithLogicalBasis
              (in_stack_00000020,in_stack_0000001c,in_stack_00000018,in_stack_00000014,
               in_stack_00000010);
  }
  return;
}

Assistant:

void HModel::util_addCols(int ncols, const double* XcolCost, const double* XcolLower, const double* XcolUpper,
			  int nnonz, const int* XAstart, const int* XAindex, const double* XAvalue) {
  assert(ncols >= 0);
  assert(nnonz >= 0);
  //ToDo How to check that Astart[numCol] exists in util_addCols?
#ifdef JAJH_dev
  printf("Called model.util_addCols(ncols=%d, nnonz = %d)\n", ncols, nnonz);cout << flush;
#endif
  printf("Called model.util_addCols(ncols=%d, nnonz = %d)\n", ncols, nnonz);cout << flush;

  if (ncols==0) return;

  int nwNumCol = numCol + ncols;
  colCost.resize(nwNumCol);
  colLower.resize(nwNumCol);
  colUpper.resize(nwNumCol);
  colScale.resize(nwNumCol);
  Astart.resize(nwNumCol+1);

  //Note that the new columns must have starts, even if they have no entries (yet)
  for (int col = 0; col < ncols; col++) {
    colCost[numCol+col] = XcolCost[col];
    colLower[numCol+col] = XcolLower[col];
    colUpper[numCol+col] = XcolUpper[col];
    colScale[numCol+col] = 1.0;
    printf("In HModel::util_addCols: column %d: setting Astart[numCol+col+1] = %d \n", col, Astart[numCol]); cout<<flush;
    Astart[numCol+col+1] = Astart[numCol];
  }

  printf("In HModel::util_addCols: nnonz = %d; cuNnonz = %d\n", nnonz, Astart[numCol]); cout<<flush;
  if (nnonz > 0) {
    //Determine the current number of nonzeros
    int cuNnonz = Astart[numCol];

    //Determine the new number of nonzeros and resize the column-wise matrix arrays
    int nwNnonz = cuNnonz + nnonz;
    //Astart.resize(nwNumCol+1);
    Aindex.resize(nwNnonz);
    Avalue.resize(nwNnonz);

    //Add the new columns
    for (int col = 0; col < ncols; col++) {
      printf("In HModel::util_addCols: column %d: setting Astart[numCol+col] = %d = %d + %d\n",
	     col, XAstart[col]+cuNnonz, XAstart[col], cuNnonz); cout<<flush;
      Astart[numCol+col] = XAstart[col]+cuNnonz;
    }
    printf("In HModel::util_addCols: setting Astart[numCol+ncols] = %d\n", nwNnonz); cout<<flush;
    Astart[numCol+ncols] = nwNnonz;


    for (int el = 0; el < nnonz; el++) {
      int row = XAindex[el];
#ifdef H2DEBUG
      assert(row >=0);
      assert(row < numRow);
#endif
      Aindex[cuNnonz+el] = row;
      Avalue[cuNnonz+el] = XAvalue[el];
    }
  }
  //Increase the number of columns and total number of variables in the model
  numCol += ncols;
  numTot += ncols;

  printf("In HModel::util_addCols: Model now has Astart[%d] = %d nonzeros\n", numCol, Astart[numCol]); cout<<flush;


  //Update the basis and work vectors correponding to new nonbasic columns
  extendWithLogicalBasis(numCol-ncols, numCol-1, numRow, -1);

}